

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_for_code_point.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::debugging_internal::Utf8ForCodePoint::Utf8ForCodePoint
          (Utf8ForCodePoint *this,uint64_t code_point)

{
  byte bVar1;
  Utf8ForCodePoint *local_20;
  uint64_t code_point_local;
  Utf8ForCodePoint *this_local;
  
  local_20 = this;
  do {
    local_20->bytes[0] = '\0';
    local_20 = (Utf8ForCodePoint *)(local_20->bytes + 1);
  } while (local_20 != (Utf8ForCodePoint *)&this->length);
  this->length = 0;
  bVar1 = (byte)code_point;
  if (code_point < 0x80) {
    this->length = 1;
    this->bytes[0] = bVar1;
  }
  else if (code_point < 0x800) {
    this->length = 2;
    this->bytes[0] = (byte)(code_point >> 6) | 0xc0;
    this->bytes[1] = bVar1 & 0x3f | 0x80;
  }
  else if ((code_point < 0xd800) || (0xdfff < code_point)) {
    if (code_point < 0x10000) {
      this->length = 3;
      this->bytes[0] = (byte)(code_point >> 0xc) | 0xe0;
      this->bytes[1] = (byte)(code_point >> 6) & 0x3f | 0x80;
      this->bytes[2] = bVar1 & 0x3f | 0x80;
    }
    else if (code_point < 0x110000) {
      this->length = 4;
      this->bytes[0] = (byte)(code_point >> 0x12) | 0xf0;
      this->bytes[1] = (byte)(code_point >> 0xc) & 0x3f | 0x80;
      this->bytes[2] = (byte)(code_point >> 6) & 0x3f | 0x80;
      this->bytes[3] = bVar1 & 0x3f | 0x80;
    }
  }
  return;
}

Assistant:

Utf8ForCodePoint::Utf8ForCodePoint(uint64_t code_point) {
  if (code_point <= kMax1ByteCodePoint) {
    length = 1;
    bytes[0] = static_cast<char>(code_point);
    return;
  }

  if (code_point <= kMax2ByteCodePoint) {
    length = 2;
    bytes[0] = static_cast<char>(0xc0 | (code_point >> 6));
    bytes[1] = static_cast<char>(0x80 | (code_point & 0x3f));
    return;
  }

  if (kMinSurrogate <= code_point && code_point <= kMaxSurrogate) return;

  if (code_point <= kMax3ByteCodePoint) {
    length = 3;
    bytes[0] = static_cast<char>(0xe0 | (code_point >> 12));
    bytes[1] = static_cast<char>(0x80 | ((code_point >> 6) & 0x3f));
    bytes[2] = static_cast<char>(0x80 | (code_point & 0x3f));
    return;
  }

  if (code_point > kMaxCodePoint) return;

  length = 4;
  bytes[0] = static_cast<char>(0xf0 | (code_point >> 18));
  bytes[1] = static_cast<char>(0x80 | ((code_point >> 12) & 0x3f));
  bytes[2] = static_cast<char>(0x80 | ((code_point >> 6) & 0x3f));
  bytes[3] = static_cast<char>(0x80 | (code_point & 0x3f));
}